

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall
duckdb::StringValueResult::StringValueResult
          (StringValueResult *this,CSVStates *states,CSVStateMachine *state_machine,
          shared_ptr<duckdb::CSVBufferHandle,_true> *buffer_handle,Allocator *buffer_allocator,
          idx_t result_size_p,idx_t buffer_position,CSVErrorHandler *error_hander_p,
          CSVIterator *iterator_p,bool store_line_size_p,
          shared_ptr<duckdb::CSVFileScan,_true> *csv_file_scan_p,idx_t *lines_read_p,bool sniffing_p
          ,string *path_p,idx_t scan_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppvVar2;
  pointer *pppVVar3;
  unsafe_unique_array<const_char_*> *puVar4;
  shared_ptr<duckdb::CSVFileScan,_true> *this_00;
  ParseTypeInfo *pPVar5;
  CSVReaderOptions *pCVar6;
  pointer pcVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  _Head_base<0UL,_duckdb::ParseTypeInfo_*,_false> _Var11;
  _Head_base<0UL,_bool_*,_false> _Var12;
  _Base_ptr p_Var13;
  pointer pVVar14;
  iterator __position;
  iterator __position_00;
  _Head_base<0UL,_const_char_**,_false> _Var15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  CSVIterator *pCVar17;
  idx_t *piVar18;
  element_type *peVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  undefined8 uVar21;
  element_type *peVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  char cVar24;
  bool bVar25;
  char cVar26;
  uint uVar27;
  CSVBufferHandle *pCVar28;
  mapped_type *this_01;
  _Head_base<0UL,_duckdb::ParseTypeInfo_*,_false> _Var29;
  CSVFileScan *pCVar30;
  CSVBufferManager *pCVar31;
  DatabaseInstance *this_02;
  reference other;
  ulong uVar32;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  _Head_base<0UL,_bool_*,_false> __s;
  _Base_ptr p_Var33;
  long *plVar34;
  _Head_base<0UL,_const_char_**,_false> _Var35;
  _Head_base<0UL,_unsigned_long_*,_false> _Var36;
  const_reference pvVar37;
  mapped_type *pmVar38;
  InvalidInputException *this_03;
  ulong uVar39;
  _Base_ptr p_Var40;
  size_type __n;
  pointer *__ptr;
  pointer *__ptr_1;
  ValidityMask *pVVar41;
  pointer pVVar42;
  optional_ptr<duckdb::FileBuffer,_true> *this_04;
  long lVar43;
  LogicalType varchar_type;
  vector<duckdb::LogicalType,_true> logical_types;
  vector<duckdb::Vector,_true> *__range1;
  undefined1 local_110 [32];
  unsafe_unique_array<ParseTypeInfo> *local_f0;
  LogicalType local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  LogicalType local_c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  DataChunk *local_88;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  vector<duckdb::ValidityMask*,std::allocator<duckdb::ValidityMask*>> *local_78;
  vector<void*,std::allocator<void*>> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  StrpTimeFormat *local_60;
  StrpTimeFormat *local_58;
  Allocator *local_50;
  
  (this->super_ScannerResult).quoted = false;
  (this->super_ScannerResult).unquoted = false;
  (this->super_ScannerResult).escaped = false;
  (this->super_ScannerResult).comment = false;
  (this->super_ScannerResult).quoted_position = 0;
  (this->super_ScannerResult).last_position.buffer_pos = 0;
  (this->super_ScannerResult).last_position.buffer_size = 0;
  (this->super_ScannerResult).last_position.buffer_idx = 0;
  (this->super_ScannerResult).result_size = result_size_p;
  (this->super_ScannerResult).state_machine = state_machine;
  (this->super_ScannerResult).states = states;
  local_70 = (vector<void*,std::allocator<void*>> *)&this->vector_ptr;
  local_78 = (vector<duckdb::ValidityMask*,std::allocator<duckdb::ValidityMask*>> *)
             &this->validity_mask;
  (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->validity_mask).
  super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
  super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->validity_mask).
  super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
  super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->validity_mask).
  super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
  super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = buffer_allocator;
  uVar27 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                     ((state_machine->dialect_options).num_cols);
  this->number_of_columns = uVar27;
  pCVar6 = state_machine->options;
  this->null_padding = pCVar6->null_padding;
  this->ignore_errors = (pCVar6->ignore_errors).value;
  this->extra_delimiter_bytes =
       (state_machine->dialect_options).state_machine_options.delimiter.value._M_string_length - 1;
  puVar4 = &this->null_str_ptr;
  local_88 = &this->parse_chunk;
  (this->null_str_ptr).super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
  super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  (this->null_str_size).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
  _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)0x0;
  DataChunk::DataChunk(local_88);
  this->number_of_rows = 0;
  this->cur_col_id = 0;
  this->figure_out_new_line = false;
  this->error_handler = error_hander_p;
  this->iterator = iterator_p;
  (this->current_line_position).begin.buffer_pos = 0;
  (this->current_line_position).begin.buffer_size = 0;
  (this->current_line_position).begin.buffer_idx = 0;
  (this->current_line_position).end.buffer_pos = 0;
  (this->current_line_position).end.buffer_size = 0;
  (this->current_line_position).end.buffer_idx = 0;
  (this->line_positions_per_row)._M_h._M_buckets =
       &(this->line_positions_per_row)._M_h._M_single_bucket;
  (this->line_positions_per_row)._M_h._M_bucket_count = 1;
  (this->line_positions_per_row)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->line_positions_per_row)._M_h._M_element_count = 0;
  (this->line_positions_per_row)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->line_positions_per_row)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->line_positions_per_row)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->store_line_size = store_line_size_p;
  this->added_last_line = false;
  this->quoted_new_line = false;
  local_f0 = &this->parse_types;
  local_c8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->names;
  (this->parse_types).
  super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
  super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl = (ParseTypeInfo *)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar19 = (csv_file_scan_p->internal).
            super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var20 = (csv_file_scan_p->internal).
            super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (csv_file_scan_p->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar19;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var20;
  (csv_file_scan_p->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->lines_read = lines_read_p;
  this->chunk_col_id = 0;
  this->icu_loaded = false;
  local_80 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->buffer_handles;
  (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  this->projecting_columns = false;
  (this->buffer_handles)._M_h._M_buckets = &(this->buffer_handles)._M_h._M_single_bucket;
  (this->buffer_handles)._M_h._M_bucket_count = 1;
  (this->buffer_handles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffer_handles)._M_h._M_element_count = 0;
  (this->buffer_handles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffer_handles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffer_handles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar25 = CSVReaderOptions::IgnoreErrors(state_machine->options);
  *(undefined8 *)
   ((long)&(this->current_errors).current_errors.
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->current_errors).current_errors.
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->current_errors).current_errors.
  super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
  super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->current_errors).current_errors.
  super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
  super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->current_errors).ignore_errors = bVar25;
  (this->current_errors).scan_id = scan_id;
  local_58 = &this->date_format;
  StrpTimeFormat::StrpTimeFormat(local_58);
  local_60 = &this->timestamp_format;
  StrpTimeFormat::StrpTimeFormat(local_60);
  this->sniffing = sniffing_p;
  (this->borked_rows)._M_h._M_buckets = &(this->borked_rows)._M_h._M_single_bucket;
  (this->borked_rows)._M_h._M_bucket_count = 1;
  (this->borked_rows)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->borked_rows)._M_h._M_element_count = 0;
  (this->borked_rows)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->borked_rows)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->borked_rows)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68 = &(this->path).field_2;
  (this->path)._M_dataplus._M_p = (pointer)local_68;
  pcVar7 = (path_p->_M_dataplus)._M_p;
  paVar1 = &path_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 == paVar1) {
    uVar21 = *(undefined8 *)((long)&path_p->field_2 + 8);
    local_68->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->path).field_2 + 8) = uVar21;
  }
  else {
    (this->path)._M_dataplus._M_p = pcVar7;
    (this->path).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->path)._M_string_length = path_p->_M_string_length;
  (path_p->_M_dataplus)._M_p = (pointer)paVar1;
  path_p->_M_string_length = 0;
  (path_p->field_2)._M_local_buf[0] = '\0';
  this->first_line_is_comment = false;
  this->ignore_empty_values = true;
  if ((buffer_handle->internal).
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar28 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    this_01 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_80,&pCVar28->buffer_idx);
    shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(this_01,buffer_handle);
    pCVar28 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    this_04 = &(pCVar28->handle).node;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_04);
    this->buffer_ptr = (char *)this_04->ptr->buffer;
    pCVar28 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    this->buffer_size = pCVar28->actual_size;
    pCVar28 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    iVar8 = pCVar28->buffer_idx;
    iVar9 = this->buffer_size;
    (this->super_ScannerResult).last_position.buffer_pos = buffer_position;
    (this->super_ScannerResult).last_position.buffer_size = iVar9;
    (this->super_ScannerResult).last_position.buffer_idx = iVar8;
    pCVar28 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    this->requested_size = pCVar28->requested_size;
    iVar8 = (this->iterator->pos).buffer_idx;
    iVar9 = (this->iterator->pos).buffer_pos;
    pCVar28 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    iVar10 = pCVar28->actual_size;
    (this->current_line_position).begin.buffer_pos = iVar9;
    (this->current_line_position).begin.buffer_size = iVar10;
    (this->current_line_position).begin.buffer_idx = iVar8;
    iVar8 = (this->current_line_position).begin.buffer_size;
    (this->current_line_position).end.buffer_pos = (this->current_line_position).begin.buffer_pos;
    (this->current_line_position).end.buffer_size = iVar8;
    (this->current_line_position).end.buffer_idx = (this->current_line_position).begin.buffer_idx;
    local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar39 = (ulong)this->number_of_columns;
    _Var29._M_head_impl = (ParseTypeInfo *)operator_new__(uVar39 * 5);
    if (uVar39 != 0) {
      switchD_01306cb1::default(_Var29._M_head_impl,0,((uVar39 * 5 - 5) / 5) * 5 + 5);
    }
    _Var11._M_head_impl =
         (local_f0->
         super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
         .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
    (local_f0->
    super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>)._M_t.
    super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
    super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl = _Var29._M_head_impl;
    if (_Var11._M_head_impl != (ParseTypeInfo *)0x0) {
      operator_delete__(_Var11._M_head_impl);
    }
    LogicalType::LogicalType(&local_c0,VARCHAR);
    this_00 = &this->csv_file_scan;
    if ((this_00->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      if (this->number_of_columns != 0) {
        uVar39 = 0;
        do {
          uVar21 = local_110._0_8_;
          local_110[1] = local_c0.id_;
          local_110[0] = (string)0x1;
          local_110._3_5_ = SUB85(uVar21,3);
          local_110[2] = local_c0.physical_type_;
          if (local_c0.id_ == INTERVAL) {
            LogicalType::GetDecimalProperties(&local_c0,local_110 + 4,local_110 + 3);
          }
          uVar21 = local_110._0_8_;
          _Var29._M_head_impl =
               (local_f0->
               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
          *(uint8_t *)((long)(_Var29._M_head_impl + uVar39) + 4) = local_110[4];
          pPVar5 = _Var29._M_head_impl + uVar39;
          pPVar5->validate_utf8 = (bool)local_110[0];
          pPVar5->type_id = local_110[1];
          pPVar5->internal_type = local_110[2];
          pPVar5->scale = local_110[3];
          local_110._0_8_ = uVar21;
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_a8,
                     &LogicalType::VARCHAR);
          cVar26 = '\x01';
          if (9 < uVar39) {
            uVar32 = uVar39;
            cVar24 = '\x04';
            do {
              cVar26 = cVar24;
              if (uVar32 < 100) {
                cVar26 = cVar26 + -2;
                goto LAB_0150c1cc;
              }
              if (uVar32 < 1000) {
                cVar26 = cVar26 + -1;
                goto LAB_0150c1cc;
              }
              if (uVar32 < 10000) goto LAB_0150c1cc;
              bVar25 = 99999 < uVar32;
              uVar32 = uVar32 / 10000;
              cVar24 = cVar26 + '\x04';
            } while (bVar25);
            cVar26 = cVar26 + '\x01';
          }
LAB_0150c1cc:
          local_e8._0_8_ =
               &local_e8.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar26);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_e8._0_8_,
                     (uint)local_e8.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,uVar39);
          plVar34 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_e8,0,(char *)0x0,0x1e2b2be);
          pVVar41 = (ValidityMask *)(plVar34 + 2);
          if ((ValidityMask *)*plVar34 == pVVar41) {
            local_110._16_8_ = (pVVar41->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            local_110._24_8_ = plVar34[3];
            local_110._0_8_ = (ValidityMask *)(local_110 + 0x10);
          }
          else {
            local_110._16_8_ = (pVVar41->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            local_110._0_8_ = (ValidityMask *)*plVar34;
          }
          local_110._8_8_ = plVar34[1];
          *plVar34 = (long)pVVar41;
          plVar34[1] = 0;
          *(undefined1 *)(plVar34 + 2) = 0;
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_ !=
              &local_e8.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)local_e8._0_8_);
          }
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
          ;
          if ((ValidityMask *)local_110._0_8_ != (ValidityMask *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 < this->number_of_columns);
      }
    }
    else {
      pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
      uVar39 = ((long)(pCVar30->file_types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar30->file_types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (this->number_of_columns <= uVar39 && uVar39 - this->number_of_columns != 0) {
        this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_110._0_8_ = local_110 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,
                   "Mismatch between the number of columns (%d) in the CSV file and what is expected in the scanner (%d)."
                   ,"");
        uVar27 = this->number_of_columns;
        pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
        InvalidInputException::InvalidInputException<unsigned_int,unsigned_long>
                  (this_03,(string *)local_110,uVar27,
                   ((long)(pCVar30->file_types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar30->file_types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
        __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
      pCVar31 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&pCVar30->buffer_manager);
      this_02 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar31->context->db);
      local_110._0_8_ = (ValidityMask *)(local_110 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"icu","");
      bVar25 = DatabaseInstance::ExtensionIsLoaded(this_02,(string *)local_110);
      this->icu_loaded = bVar25;
      if ((ValidityMask *)local_110._0_8_ != (ValidityMask *)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_);
      }
      lVar43 = 0;
      for (uVar39 = 0; pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00),
          uVar39 < (ulong)(((long)(pCVar30->file_types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pCVar30->file_types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555); uVar39 = uVar39 + 1) {
        pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
        other = vector<duckdb::LogicalType,_true>::operator[](&pCVar30->file_types,uVar39);
        LogicalType::LogicalType((LogicalType *)local_110,other);
        bVar25 = LogicalType::IsJSONType((LogicalType *)local_110);
        if (bVar25) {
          LogicalType::LogicalType(&local_e8,VARCHAR);
          _Var23._M_pi = local_e8.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          peVar22 = local_e8.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar21 = local_e8._0_8_;
          local_110[0] = (string)local_e8.id_;
          local_110[1] = local_e8.physical_type_;
          local_e8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._16_8_;
          local_e8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_110._8_8_;
          local_110._16_8_ = _Var23._M_pi;
          local_110._8_8_ = peVar22;
          local_e8._0_8_ = uVar21;
          LogicalType::~LogicalType(&local_e8);
        }
        uVar32 = local_110._0_8_ & 0xff;
        if (uVar32 < 0x21) {
          if ((0xf0e9fc00UL >> (local_110._0_8_ & 0x3f) & 1) == 0) {
            if (uVar32 == 0x19) {
              cVar26 = LogicalType::IsJSONType((LogicalType *)local_110);
            }
            else {
              if (uVar32 != 0x20) goto LAB_0150beac;
              cVar26 = this->icu_loaded;
            }
            if (cVar26 != '\0') goto LAB_0150beac;
          }
          uVar21 = local_e8._0_8_;
          local_e8.physical_type_ = (PhysicalType)local_110[0];
          local_e8.id_ = SQLNULL;
          local_e8._3_5_ = SUB85(uVar21,3);
          local_e8._2_1_ = local_110[1];
          if (local_110[0] == (string)0x15) {
            LogicalType::GetDecimalProperties
                      ((LogicalType *)local_110,(uint8_t *)((long)&local_e8 + 4),
                       (uint8_t *)((long)&local_e8 + 3));
          }
          _Var29._M_head_impl =
               (local_f0->
               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
          *(undefined1 *)((long)&(_Var29._M_head_impl)->width + lVar43) = local_e8._4_1_;
          *(undefined4 *)((long)&(_Var29._M_head_impl)->validate_utf8 + lVar43) = local_e8._0_4_;
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalType&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_a8,
                     (LogicalType *)local_110);
        }
        else {
LAB_0150beac:
          uVar21 = local_e8._0_8_;
          local_e8.id_ = SQLNULL;
          if (local_110[0] != (string)0x19) {
            if ((byte)(local_110[1] - LIST) < 7) {
              local_e8.id_ = (LogicalTypeId)(0x1000000000101 >> ((local_110[1] - LIST & 7) << 3));
            }
            else {
              local_e8.id_ = INVALID;
            }
          }
          local_e8.physical_type_ = local_c0.id_;
          local_e8._3_5_ = SUB85(uVar21,3);
          local_e8._2_1_ = local_c0.physical_type_;
          if (local_c0.id_ == INTERVAL) {
            LogicalType::GetDecimalProperties
                      (&local_c0,(uint8_t *)((long)&local_e8 + 4),(uint8_t *)((long)&local_e8 + 3));
          }
          _Var29._M_head_impl =
               (local_f0->
               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
          *(undefined1 *)((long)&(_Var29._M_head_impl)->width + lVar43) = local_e8._4_1_;
          *(undefined4 *)((long)&(_Var29._M_head_impl)->validate_utf8 + lVar43) = local_e8._0_4_;
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_a8,
                     &LogicalType::VARCHAR);
        }
        LogicalType::~LogicalType((LogicalType *)local_110);
        lVar43 = lVar43 + 5;
      }
      pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
      __x = &CSVFileScan::GetNames_abi_cxx11_(pCVar30)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(local_c8,__x);
      pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
      if ((pCVar30->projected_columns)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        this->projecting_columns = false;
        uVar27 = this->number_of_columns;
        __s._M_head_impl = (bool *)operator_new__((ulong)uVar27);
        switchD_01306cb1::default(__s._M_head_impl,0,(ulong)uVar27);
        _Var12._M_head_impl =
             (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl = __s._M_head_impl;
        if (_Var12._M_head_impl != (bool *)0x0) {
          operator_delete__(_Var12._M_head_impl);
        }
        if (this->number_of_columns != 0) {
          uVar39 = 0;
          do {
            pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
            p_Var40 = &(pCVar30->projected_columns)._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var33 = p_Var40;
            for (p_Var13 = (pCVar30->projected_columns)._M_t._M_impl.super__Rb_tree_header._M_header
                           ._M_parent; p_Var13 != (_Base_ptr)0x0;
                p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar39]) {
              if (*(ulong *)(p_Var13 + 1) >= uVar39) {
                p_Var33 = p_Var13;
              }
            }
            if ((p_Var33 != p_Var40) && (*(ulong *)(p_Var33 + 1) <= uVar39)) {
              p_Var40 = p_Var33;
            }
            pCVar30 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_00);
            bVar25 = (_Rb_tree_header *)p_Var40 !=
                     &(pCVar30->projected_columns)._M_t._M_impl.super__Rb_tree_header;
            if (!bVar25) {
              this->projecting_columns = true;
            }
            (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
            super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
            super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar39] = bVar25;
            uVar39 = uVar39 + 1;
          } while (uVar39 < this->number_of_columns);
        }
      }
      if (this->projecting_columns == false) {
        lVar43 = (long)local_a8.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        uVar39 = lVar43 * -0x5555555555555555;
        if (uVar39 < this->number_of_columns) {
          lVar43 = lVar43 * 0x5555555555555557;
          do {
            uVar21 = local_110._0_8_;
            local_110[1] = local_c0.id_;
            local_110[0] = (string)0x1;
            local_110._3_5_ = SUB85(uVar21,3);
            local_110[2] = local_c0.physical_type_;
            if (local_c0.id_ == INTERVAL) {
              LogicalType::GetDecimalProperties(&local_c0,local_110 + 4,local_110 + 3);
            }
            _Var29._M_head_impl =
                 (local_f0->
                 super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                 .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
            *(uint8_t *)((long)&(_Var29._M_head_impl)->width + lVar43) = local_110[4];
            *(undefined4 *)((long)&(_Var29._M_head_impl)->validate_utf8 + lVar43) = local_110._0_4_;
            ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
            emplace_back<duckdb::LogicalTypeId_const&>
                      ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_a8,
                       &LogicalType::VARCHAR);
            uVar39 = uVar39 + 1;
            lVar43 = lVar43 + 5;
          } while (uVar39 < this->number_of_columns);
        }
      }
    }
    DataChunk::Initialize
              (local_88,local_50,(vector<duckdb::LogicalType,_true> *)&local_a8,
               (this->super_ScannerResult).result_size);
    pVVar42 = (this->parse_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
              .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar14 = (this->parse_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
              .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pVVar42 != pVVar14) {
      pVVar41 = &pVVar42->validity;
      do {
        local_110._0_8_ = *(undefined8 *)((LogicalType *)(pVVar41 + -1) + 1);
        __position._M_current =
             (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          ::std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*>
                    (local_70,__position,(void **)local_110);
        }
        else {
          *__position._M_current = (void *)local_110._0_8_;
          pppvVar2 = &(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                      super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppvVar2 = *pppvVar2 + 1;
        }
        FlatVector::VerifyFlatVector
                  ((Vector *)&pVVar41[-2].super_TemplatedValidityMask<unsigned_long>.capacity);
        __position_00._M_current =
             (this->validity_mask).
             super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
             super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_110._0_8_ = pVVar41;
        if (__position_00._M_current ==
            (this->validity_mask).
            super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
            super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::ValidityMask*,std::allocator<duckdb::ValidityMask*>>::
          _M_realloc_insert<duckdb::ValidityMask*>
                    (local_78,__position_00,(ValidityMask **)local_110);
        }
        else {
          *__position_00._M_current = pVVar41;
          pppVVar3 = &(this->validity_mask).
                      super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                      super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppVVar3 = *pppVVar3 + 1;
        }
        pVVar42 = (pointer)(pVVar41 + 2);
        pVVar41 = (ValidityMask *)
                  &pVVar41[3].super_TemplatedValidityMask<unsigned_long>.validity_data;
      } while (pVVar42 != pVVar14);
    }
    lVar43 = (long)(state_machine->options->null_str).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(state_machine->options->null_str).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar39 = lVar43 >> 5;
    this->null_str_count = uVar39;
    _Var35._M_head_impl = (char **)operator_new__(-(ulong)(uVar39 >> 0x3d != 0) | lVar43 >> 2);
    _Var15._M_head_impl =
         (puVar4->super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>)._M_t.
         super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
         super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
         super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    (puVar4->super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>)._M_t.
    super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
    super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
    super__Head_base<0UL,_const_char_**,_false>._M_head_impl = _Var35._M_head_impl;
    if (_Var15._M_head_impl != (char **)0x0) {
      operator_delete__(_Var15._M_head_impl);
    }
    uVar39 = 0xffffffffffffffff;
    if (this->null_str_count < 0x2000000000000000) {
      uVar39 = this->null_str_count * 8;
    }
    _Var36._M_head_impl = (unsigned_long *)operator_new__(uVar39);
    _Var16._M_head_impl =
         (this->null_str_size).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    (this->null_str_size).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
    _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = _Var36._M_head_impl;
    if (_Var16._M_head_impl != (unsigned_long *)0x0) {
      operator_delete__(_Var16._M_head_impl);
    }
    if (this->null_str_count != 0) {
      __n = 0;
      do {
        pvVar37 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&state_machine->options->null_str,__n);
        (puVar4->super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>)._M_t.
        super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
        super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
        super__Head_base<0UL,_const_char_**,_false>._M_head_impl[__n] = (pvVar37->_M_dataplus)._M_p;
        pvVar37 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&state_machine->options->null_str,__n);
        (this->null_str_size).
        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[__n] = pvVar37->_M_string_length;
        __n = __n + 1;
      } while (__n < this->null_str_count);
    }
    local_110[0] = (string)0xf;
    pmVar38 = ::std::
              map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
              ::at(&(state_machine->options->dialect_options).date_format,local_110);
    ::std::__cxx11::string::_M_assign
              ((string *)&(this->date_format).super_StrTimeFormat.format_specifier);
    ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::operator=
              (&(this->date_format).super_StrTimeFormat.specifiers.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>,
               &(pmVar38->value).super_StrTimeFormat.specifiers.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this->date_format).super_StrTimeFormat.literals,
                &(pmVar38->value).super_StrTimeFormat.literals.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    (this->date_format).super_StrTimeFormat.constant_size =
         (pmVar38->value).super_StrTimeFormat.constant_size;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this->date_format).super_StrTimeFormat.numeric_width.
                super_vector<int,_std::allocator<int>_>,
               &(pmVar38->value).super_StrTimeFormat.numeric_width.
                super_vector<int,_std::allocator<int>_>);
    local_110[0] = (string)0x13;
    pmVar38 = ::std::
              map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
              ::at(&(state_machine->options->dialect_options).date_format,local_110);
    ::std::__cxx11::string::_M_assign
              ((string *)&(this->timestamp_format).super_StrTimeFormat.format_specifier);
    ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::operator=
              (&(this->timestamp_format).super_StrTimeFormat.specifiers.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>,
               &(pmVar38->value).super_StrTimeFormat.specifiers.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this->timestamp_format).super_StrTimeFormat.literals,
                &(pmVar38->value).super_StrTimeFormat.literals.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    (this->timestamp_format).super_StrTimeFormat.constant_size =
         (pmVar38->value).super_StrTimeFormat.constant_size;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this->timestamp_format).super_StrTimeFormat.numeric_width.
                super_vector<int,_std::allocator<int>_>,
               &(pmVar38->value).super_StrTimeFormat.numeric_width.
                super_vector<int,_std::allocator<int>_>);
    this->decimal_separator = *(state_machine->options->decimal_separator)._M_dataplus._M_p;
    pCVar17 = this->iterator;
    if (pCVar17->first_one == true) {
      piVar18 = this->lines_read;
      *piVar18 = *piVar18 +
                 (ulong)(state_machine->dialect_options).header.value +
                 (state_machine->dialect_options).skip_rows.value;
      if (*piVar18 == 0) {
        StringUtil::SkipBOM(this->buffer_ptr,&this->buffer_size,&(pCVar17->pos).buffer_pos);
      }
    }
    this->ignore_empty_values =
         ((state_machine->dialect_options).state_machine_options.comment.value != ' ' &&
         ((state_machine->dialect_options).state_machine_options.escape.value != ' ' &&
         (state_machine->dialect_options).state_machine_options.quote.value != ' ')) &&
         *(state_machine->dialect_options).state_machine_options.delimiter.value._M_dataplus._M_p !=
         ' ';
    LogicalType::~LogicalType(&local_c0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a8);
  }
  return;
}

Assistant:

StringValueResult::StringValueResult(CSVStates &states, CSVStateMachine &state_machine,
                                     const shared_ptr<CSVBufferHandle> &buffer_handle, Allocator &buffer_allocator,
                                     idx_t result_size_p, idx_t buffer_position, CSVErrorHandler &error_hander_p,
                                     CSVIterator &iterator_p, bool store_line_size_p,
                                     shared_ptr<CSVFileScan> csv_file_scan_p, idx_t &lines_read_p, bool sniffing_p,
                                     string path_p, idx_t scan_id)
    : ScannerResult(states, state_machine, result_size_p),
      number_of_columns(NumericCast<uint32_t>(state_machine.dialect_options.num_cols)),
      null_padding(state_machine.options.null_padding), ignore_errors(state_machine.options.ignore_errors.GetValue()),
      extra_delimiter_bytes(state_machine.dialect_options.state_machine_options.delimiter.GetValue().size() - 1),
      error_handler(error_hander_p), iterator(iterator_p), store_line_size(store_line_size_p),
      csv_file_scan(std::move(csv_file_scan_p)), lines_read(lines_read_p),
      current_errors(scan_id, state_machine.options.IgnoreErrors()), sniffing(sniffing_p), path(std::move(path_p)) {
	// Vector information
	D_ASSERT(number_of_columns > 0);
	if (!buffer_handle) {
		// It Was Over Before It Even Began
		D_ASSERT(iterator.done);
		return;
	}
	buffer_handles[buffer_handle->buffer_idx] = buffer_handle;
	// Buffer Information
	buffer_ptr = buffer_handle->Ptr();
	buffer_size = buffer_handle->actual_size;
	last_position = {buffer_handle->buffer_idx, buffer_position, buffer_size};
	requested_size = buffer_handle->requested_size;
	// Current Result information
	current_line_position.begin = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, buffer_handle->actual_size};
	current_line_position.end = current_line_position.begin;
	// Fill out Parse Types
	vector<LogicalType> logical_types;
	parse_types = make_unsafe_uniq_array<ParseTypeInfo>(number_of_columns);
	LogicalType varchar_type = LogicalType::VARCHAR;
	if (!csv_file_scan) {
		for (idx_t i = 0; i < number_of_columns; i++) {
			parse_types[i] = ParseTypeInfo(varchar_type, true);
			logical_types.emplace_back(LogicalType::VARCHAR);
			string name = "Column_" + to_string(i);
			names.emplace_back(name);
		}
	} else {
		if (csv_file_scan->file_types.size() > number_of_columns) {
			throw InvalidInputException(
			    "Mismatch between the number of columns (%d) in the CSV file and what is expected in the scanner (%d).",
			    number_of_columns, csv_file_scan->file_types.size());
		}
		icu_loaded = csv_file_scan->buffer_manager->context.db->ExtensionIsLoaded("icu");
		for (idx_t i = 0; i < csv_file_scan->file_types.size(); i++) {
			auto type = csv_file_scan->file_types[i];
			if (type.IsJSONType()) {
				type = LogicalType::VARCHAR;
			}
			if (StringValueScanner::CanDirectlyCast(type, icu_loaded)) {
				parse_types[i] = ParseTypeInfo(type, true);
				logical_types.emplace_back(type);
			} else {
				parse_types[i] = ParseTypeInfo(varchar_type, type.id() == LogicalTypeId::VARCHAR || type.IsNested());
				logical_types.emplace_back(LogicalType::VARCHAR);
			}
		}
		names = csv_file_scan->GetNames();
		if (!csv_file_scan->projected_columns.empty()) {
			projecting_columns = false;
			projected_columns = make_unsafe_uniq_array<bool>(number_of_columns);
			for (idx_t col_idx = 0; col_idx < number_of_columns; col_idx++) {
				if (csv_file_scan->projected_columns.find(col_idx) == csv_file_scan->projected_columns.end()) {
					// Column is not projected
					projecting_columns = true;
					projected_columns[col_idx] = false;
				} else {
					projected_columns[col_idx] = true;
				}
			}
		}
		if (!projecting_columns) {
			for (idx_t j = logical_types.size(); j < number_of_columns; j++) {
				// This can happen if we have sneaky null columns at the end that we wish to ignore
				parse_types[j] = ParseTypeInfo(varchar_type, true);
				logical_types.emplace_back(LogicalType::VARCHAR);
			}
		}
	}

	// Initialize Parse Chunk
	parse_chunk.Initialize(buffer_allocator, logical_types, result_size);
	for (auto &col : parse_chunk.data) {
		vector_ptr.push_back(FlatVector::GetData<string_t>(col));
		validity_mask.push_back(&FlatVector::Validity(col));
	}

	// Setup the NullStr information
	null_str_count = state_machine.options.null_str.size();
	null_str_ptr = make_unsafe_uniq_array_uninitialized<const char *>(null_str_count);
	null_str_size = make_unsafe_uniq_array_uninitialized<idx_t>(null_str_count);
	for (idx_t i = 0; i < null_str_count; i++) {
		null_str_ptr[i] = state_machine.options.null_str[i].c_str();
		null_str_size[i] = state_machine.options.null_str[i].size();
	}
	date_format = state_machine.options.dialect_options.date_format.at(LogicalTypeId::DATE).GetValue();
	timestamp_format = state_machine.options.dialect_options.date_format.at(LogicalTypeId::TIMESTAMP).GetValue();
	decimal_separator = state_machine.options.decimal_separator[0];

	if (iterator.first_one) {
		lines_read +=
		    state_machine.dialect_options.skip_rows.GetValue() + state_machine.dialect_options.header.GetValue();
		if (lines_read == 0) {
			SkipBOM();
		}
	}
	ignore_empty_values = state_machine.dialect_options.state_machine_options.delimiter.GetValue()[0] != ' ' &&
	                      state_machine.dialect_options.state_machine_options.quote != ' ' &&
	                      state_machine.dialect_options.state_machine_options.escape != ' ' &&
	                      state_machine.dialect_options.state_machine_options.comment != ' ';
}